

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  lu_byte lVar1;
  int iVar2;
  CallInfo *pCVar3;
  int *piVar4;
  unsigned_short uVar5;
  uint errcode;
  ushort uVar6;
  unsigned_short uVar7;
  uint *ud;
  char *msg;
  code *f;
  CallInfo **ppCVar8;
  StkId level;
  uint local_40;
  int nargs_local;
  lua_State *local_38;
  
  uVar5 = L->nny;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  nargs_local = nargs;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x2f9,"int lua_resume(lua_State *, lua_State *, int)");
  }
  lVar1 = L->status;
  if (lVar1 == '\x01') {
LAB_001175de:
    if (from == (lua_State *)0x0) {
      L->nCcalls = 1;
    }
    else {
      uVar6 = from->nCcalls + 1;
      L->nCcalls = uVar6;
      if (0x7c < uVar6) {
        msg = "C stack overflow";
        goto LAB_0011760a;
      }
    }
    L->nny = 0;
    if ((long)L->top - (long)L->ci->func >> 4 <= (long)(int)(nargs + (uint)(lVar1 == '\0'))) {
      __assert_fail("(((L->status == 0) ? nargs + 1 : nargs) < (L->top - L->ci->func)) && \"not enough elements in the stack\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x305,"int lua_resume(lua_State *, lua_State *, int)");
    }
    f = resume;
    ud = (uint *)&nargs_local;
    while (errcode = luaD_rawrunprotected(L,f,ud), ppCVar8 = &L->ci, local_40 = errcode,
          1 < (int)errcode) {
      while( true ) {
        pCVar3 = *ppCVar8;
        if (pCVar3 == (CallInfo *)0x0) {
          L->status = (lu_byte)errcode;
          luaD_seterrorobj(L,errcode,L->top);
          L->ci->top = L->top;
          goto LAB_00117728;
        }
        if ((pCVar3->callstatus & 0x10) != 0) break;
        ppCVar8 = &pCVar3->previous;
      }
      level = (StkId)((long)&L->stack->value_ + pCVar3->extra);
      local_38 = from;
      luaF_close(L,level,errcode);
      from = local_38;
      luaD_seterrorobj(L,errcode,level);
      L->ci = pCVar3;
      L->allowhook = (byte)pCVar3->callstatus & 1;
      L->nny = 0;
      luaD_shrinkstack(L);
      f = unroll;
      ud = &local_40;
      L->errfunc = (ptrdiff_t)(pCVar3->u).l.savedpc;
    }
    if (errcode != L->status) {
      __assert_fail("status == L->status",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x30d,"int lua_resume(lua_State *, lua_State *, int)");
    }
LAB_00117728:
    L->nny = uVar5;
    uVar5 = L->nCcalls - 1;
    L->nCcalls = uVar5;
    if (from == (lua_State *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = from->nCcalls;
    }
    if (uVar7 != uVar5) {
      __assert_fail("L->nCcalls == ((from) ? from->nCcalls : 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x315,"int lua_resume(lua_State *, lua_State *, int)");
    }
    piVar4 = *(int **)&L[-1].hookmask;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x316,"int lua_resume(lua_State *, lua_State *, int)");
    }
  }
  else {
    if (lVar1 == '\0') {
      if (L->ci == &L->base_ci) goto LAB_001175de;
      msg = "cannot resume non-suspended coroutine";
    }
    else {
      msg = "cannot resume dead coroutine";
    }
LAB_0011760a:
    resume_error(L,msg,nargs);
    local_40 = 2;
  }
  return local_40;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  unsigned short oldnny = L->nny;  /* save "number of non-yieldable" calls */
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  if (L->nCcalls >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  luai_userstateresume(L, nargs);
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  while (errorstatus(status) && recover(L, status)) {
    /* unroll continuation */
    status = luaD_rawrunprotected(L, unroll, &status);
  }
  if (likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = cast_byte(status);  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top);  /* push error message */
    L->ci->top = L->top;
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}